

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O2

void __thiscall
beagle::cpu::EigenDecompositionSquare<double,_1>::updateTransitionMatricesWithModelCategories
          (EigenDecompositionSquare<double,_1> *this,int *eigenIndices,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          double **transitionMatrices,int count)

{
  int iVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong *puVar19;
  ulong uVar20;
  double *pdVar21;
  int iVar22;
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  
  auVar31 = ZEXT864(0) << 0x40;
  uVar14 = 0;
  do {
    if (uVar14 == (uint)(~(count >> 0x1f) & count)) {
      return;
    }
    iVar22 = 0;
    pdVar6 = transitionMatrices[probabilityIndices[uVar14]];
    dVar2 = edgeLengths[uVar14];
    for (lVar13 = 0; lVar13 < (this->super_EigenDecomposition<double,_1>).kCategoryCount;
        lVar13 = lVar13 + 1) {
      iVar15 = eigenIndices[lVar13];
      pdVar7 = this->gIMatrices[iVar15];
      pdVar21 = this->gEMatrices[iVar15];
      pdVar8 = (this->super_EigenDecomposition<double,_1>).gEigenValues[iVar15];
      uVar11 = (ulong)(this->super_EigenDecomposition<double,_1>).kStateCount;
      uVar16 = uVar11;
      for (iVar15 = 0; uVar10 = (uint)uVar16, iVar15 < (int)uVar10; iVar15 = iVar15 + 1) {
        if (this->isComplex == true) {
          dVar24 = pdVar8[uVar11 + (long)iVar15];
          if ((dVar24 == 0.0) && (!NAN(dVar24))) goto LAB_001460c8;
          iVar1 = iVar15 + 1;
          dVar25 = exp(dVar2 * pdVar8[iVar15]);
          dVar26 = cos(dVar2 * dVar24);
          dVar24 = sin(dVar2 * dVar24);
          uVar10 = (this->super_EigenDecomposition<double,_1>).kStateCount;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = dVar26 * dVar25;
          pdVar9 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
          auVar23._8_8_ = 0x8000000000000000;
          auVar23._0_8_ = 0x8000000000000000;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = dVar24 * dVar25;
          auVar23 = vxorpd_avx512vl(auVar27,auVar23);
          lVar17 = (long)(int)(uVar10 * iVar1);
          lVar12 = (long)(int)(iVar15 * uVar10);
          for (uVar16 = 0; iVar15 = iVar1, (~((int)uVar10 >> 0x1f) & uVar10) != uVar16;
              uVar16 = uVar16 + 1) {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = pdVar7[lVar12 + uVar16];
            auVar29._8_8_ = 0;
            auVar29._0_8_ = dVar24 * dVar25 * pdVar7[lVar17 + uVar16];
            auVar27 = vfmadd231sd_fma(auVar29,auVar32,auVar3);
            pdVar9[lVar12 + uVar16] = auVar27._0_8_;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = pdVar7[lVar17 + uVar16];
            auVar30._8_8_ = 0;
            auVar30._0_8_ = auVar23._0_8_ * pdVar7[lVar12 + uVar16];
            auVar27 = vfmadd231sd_fma(auVar30,auVar32,auVar4);
            pdVar9[lVar17 + uVar16] = auVar27._0_8_;
          }
        }
        else {
LAB_001460c8:
          dVar24 = exp(dVar2 * pdVar8[iVar15]);
          uVar10 = (this->super_EigenDecomposition<double,_1>).kStateCount;
          pdVar9 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
          for (uVar16 = 0; (~((int)uVar10 >> 0x1f) & uVar10) != uVar16; uVar16 = uVar16 + 1) {
            pdVar9[(long)(int)(uVar10 * iVar15) + uVar16] =
                 dVar24 * pdVar7[(long)(int)(uVar10 * iVar15) + uVar16];
          }
        }
        uVar16 = (ulong)uVar10;
        auVar31 = ZEXT864(0) << 0x40;
      }
      for (uVar11 = 0; uVar11 != (~((int)uVar10 >> 0x1f) & uVar10); uVar11 = uVar11 + 1) {
        lVar12 = (long)iVar22;
        lVar17 = 0;
        for (uVar18 = 0; uVar18 != (uVar16 & 0xffffffff); uVar18 = uVar18 + 1) {
          auVar23 = ZEXT816(0) << 0x40;
          uVar20 = 0;
          puVar19 = (ulong *)((long)(this->super_EigenDecomposition<double,_1>).matrixTmp + lVar17);
          while ((uVar16 & 0xffffffff) != uVar20) {
            auVar28._8_8_ = 0;
            auVar28._0_8_ = pdVar21[uVar20];
            uVar20 = uVar20 + 1;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *puVar19;
            auVar23 = vfmadd231sd_fma(auVar23,auVar28,auVar5);
            puVar19 = puVar19 + (int)uVar10;
          }
          auVar23 = vmaxsd_avx(auVar23,auVar31._0_16_);
          lVar17 = lVar17 + 8;
          pdVar6[lVar12] = auVar23._0_8_;
          lVar12 = lVar12 + 1;
        }
        pdVar21 = pdVar21 + (int)uVar10;
        pdVar6[(int)lVar12] = 1.0;
        iVar22 = (int)lVar12 + 1;
      }
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatricesWithModelCategories(int* eigenIndices,
                                                        const int* probabilityIndices,
                                                        const int* firstDerivativeIndices,
                                                        const int* secondDerivativeIndices,
                                                        const double* edgeLengths,
                                                        REALTYPE** transitionMatrices,
                                                        int count) {

    for (int u = 0; u < count; u++) {
        REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
        const double edgeLength = edgeLengths[u];
        int n = 0;
        for (int l = 0; l < kCategoryCount; l++) {
            const REALTYPE distance = edgeLength;
            const REALTYPE* Ievc = gIMatrices[eigenIndices[l]];
            const REALTYPE* Evec = gEMatrices[eigenIndices[l]];
            const REALTYPE* Eval = gEigenValues[eigenIndices[l]];
            const REALTYPE* EvalImag = Eval + kStateCount;
            for(int i=0; i<kStateCount; i++) {
                if (!isComplex || EvalImag[i] == 0) {
                    const REALTYPE tmp = exp(Eval[i] * distance);
                    for(int j=0; j<kStateCount; j++) {
                        matrixTmp[i*kStateCount+j] = Ievc[i*kStateCount+j] * tmp;
                    }
                } else {
                    // 2 x 2 conjugate block
                    int i2 = i + 1;
                    const REALTYPE b = EvalImag[i];
                    const REALTYPE expat = exp(Eval[i] * distance);
                    const REALTYPE expatcosbt = expat * cos(b * distance);
                    const REALTYPE expatsinbt = expat * sin(b * distance);
                    for(int j=0; j<kStateCount; j++) {
                        matrixTmp[ i*kStateCount+j] = expatcosbt * Ievc[ i*kStateCount+j] +
                                                      expatsinbt * Ievc[i2*kStateCount+j];
                        matrixTmp[i2*kStateCount+j] = expatcosbt * Ievc[i2*kStateCount+j] -
                                                      expatsinbt * Ievc[ i*kStateCount+j];
                    }
                    i++; // processed two conjugate rows
                }
            }

#ifdef DEBUG_COMPLEX
            fprintf(stderr,"[");
                for(int i=0; i<16; i++)
                    fprintf(stderr," %7.5e,",matrixTmp[i]);
                fprintf(stderr,"] -- complex debug\n");
                exit(0);
#endif


            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {
                    REALTYPE sum = 0.0;
                    for (int k = 0; k < kStateCount; k++)
                        sum += Evec[i*kStateCount+k] * matrixTmp[k*kStateCount+j];
                    if (sum > 0)
                        transitionMat[n] = sum;
                    else
                        transitionMat[n] = 0;
                    n++;
                }
if (T_PAD != 0) {
                transitionMat[n] = 1.0;
                n += T_PAD;
}
            }
        }

        if (DEBUGGING_OUTPUT) {
            int kMatrixSize = kStateCount * kStateCount;
            fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
            for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
                fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
        }
    }
}